

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O0

string * __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::Gen1ViolMax_abi_cxx11_
          (SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,bool f_max,double viol,char *nm)

{
  size_t sVar1;
  char *in_RCX;
  byte in_DL;
  char *s;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_RDI;
  double in_XMM0_Qa;
  MemoryWriter wrt;
  BasicMemoryWriter<char,_std::allocator<char>_> *this_00;
  BasicCStringRef<char> in_stack_fffffffffffffd78;
  BasicCStringRef<char> in_stack_fffffffffffffd80;
  BasicCStringRef<char> in_stack_fffffffffffffd88;
  BasicCStringRef<char> in_stack_fffffffffffffd90;
  BasicWriter<char> *in_stack_fffffffffffffd98;
  allocator<char> local_251 [553];
  char *local_28;
  double local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  this_00 = in_RDI;
  local_28 = in_RCX;
  local_20 = in_XMM0_Qa;
  std::allocator<char>::allocator();
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
            ((BasicMemoryWriter<char,_std::allocator<char>_> *)in_stack_fffffffffffffd80.data_,
             (allocator<char> *)in_stack_fffffffffffffd78.data_);
  std::allocator<char>::~allocator(local_251);
  if (0.0 < local_20) {
    if ((local_11 & 1) != 0) {
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)&stack0xfffffffffffffd90,"{:.0E}");
      fmt::BasicWriter<char>::write<double>
                ((BasicWriter<char> *)in_stack_fffffffffffffd88.data_,in_stack_fffffffffffffd90,
                 (double *)in_stack_fffffffffffffd80.data_);
    }
    if ((local_28 != (char *)0x0) && (*local_28 != '\0')) {
      s = "[";
      if ((local_11 & 1) != 0) {
        s = " [";
      }
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)&stack0xfffffffffffffd88,s);
      fmt::BasicWriter<char>::write<>
                ((BasicWriter<char> *)in_stack_fffffffffffffd88.data_,in_stack_fffffffffffffd90);
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)&stack0xfffffffffffffd80,"{}]");
      fmt::BasicWriter<char>::write<char_const*>
                ((BasicWriter<char> *)in_stack_fffffffffffffd88.data_,in_stack_fffffffffffffd90,
                 (char **)in_stack_fffffffffffffd80.data_);
    }
  }
  sVar1 = fmt::BasicWriter<char>::size((BasicWriter<char> *)0x475da0);
  if (sVar1 == 0) {
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xfffffffffffffd78,"-");
    fmt::BasicWriter<char>::write<>
              ((BasicWriter<char> *)in_stack_fffffffffffffd88.data_,in_stack_fffffffffffffd90);
  }
  fmt::BasicWriter<char>::str_abi_cxx11_(in_stack_fffffffffffffd98);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(this_00);
  return (string *)in_RDI;
}

Assistant:

std::string Gen1ViolMax(
      bool f_max, double viol, const char* nm) {
    fmt::MemoryWriter wrt;
    if (viol>0.0) {
      if (f_max)
        wrt.write("{:.0E}", viol);
      if (nm && *nm != '\0') {
        wrt.write(f_max ? " [" : "[");
        wrt.write("{}]", nm);
      }
    }
    if (0 == wrt.size())
      wrt.write("-");
    return wrt.str();
  }